

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_GetExtPubkeyInformation_Test::TestBody
          (DescriptorKeyInfo_GetExtPubkeyInformation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  Message local_208;
  string local_200;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  Message local_1b8;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  string local_168 [8];
  string key_str;
  undefined1 local_128 [8];
  string ext_path_str;
  string local_100 [8];
  string ext_str;
  undefined1 local_d8 [8];
  string path;
  ExtPubkey pubkey;
  allocator local_31;
  undefined1 local_30 [8];
  string extkey;
  DescriptorKeyInfo_GetExtPubkeyInformation_Test *this_local;
  
  extkey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)((long)&path.field_2 + 8),(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,"0/1",(allocator *)(ext_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ext_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,"[b7665978]",(allocator *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key_str.field_2 + 8),"[b7665978/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key_str.field_2 + 8),"]");
  std::__cxx11::string::~string((string *)(key_str.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_168);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a8,"",&local_1a9);
      cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation
                (&local_188,(ExtPubkey *)((long)&path.field_2 + 8),&local_1a8);
      std::__cxx11::string::operator=(local_168,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    }
  }
  else {
    testing::Message::Message(&local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5fe,
               "Expected: key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, \"\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1b8);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d0,"key_str.c_str()","ext_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation
                (&local_200,(ExtPubkey *)((long)&path.field_2 + 8),(string *)local_d8);
      std::__cxx11::string::operator=(local_168,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
    }
  }
  else {
    testing::Message::Message(&local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x601,
               "Expected: key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_208);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_220,"key_str.c_str()","ext_path_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x602,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)local_d8);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)((long)&path.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPubkeyInformation) {
  std::string extkey = "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe";
  ExtPubkey pubkey(extkey);
  std::string path = "0/1";
  std::string ext_str = "[b7665978]";
  std::string ext_path_str = "[b7665978/" + path + "]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPubkeyInformation(pubkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}